

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O2

char * __thiscall
__cxxabiv1::anon_unknown_0::parse_base_unresolved_name<__cxxabiv1::(anonymous_namespace)::Db>
          (anon_unknown_0 *this,char *first,char *last,Db *db)

{
  anon_unknown_0 aVar1;
  anon_unknown_0 *paVar2;
  anon_unknown_0 *paVar3;
  anon_unknown_0 *paVar4;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  args;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if ((long)first - (long)this < 2) {
    return (char *)this;
  }
  aVar1 = *this;
  if (((aVar1 == (anon_unknown_0)0x6f) || (aVar1 == (anon_unknown_0)0x64)) &&
     (this[1] == (anon_unknown_0)0x6e)) {
    paVar4 = this + 2;
    if (aVar1 != (anon_unknown_0)0x6f) {
      paVar3 = paVar4;
      if (paVar4 != (anon_unknown_0 *)first) {
        paVar2 = (anon_unknown_0 *)
                 parse_unresolved_type<__cxxabiv1::(anonymous_namespace)::Db>(paVar4,first,last,db);
        if (paVar2 == paVar4) {
          paVar2 = (anon_unknown_0 *)
                   parse_simple_id<__cxxabiv1::(anonymous_namespace)::Db>
                             ((char *)paVar4,first,(Db *)last);
        }
        if ((paVar2 != paVar4) && (*(long *)(last + 8) != *(long *)(last + 0x10))) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::insert((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)(*(long *)(last + 0x10) + -0x40),0,"~");
          paVar3 = paVar2;
        }
      }
      if (paVar3 == paVar4) {
        return (char *)this;
      }
      return (char *)paVar3;
    }
    paVar2 = (anon_unknown_0 *)
             parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                       ((char *)paVar4,first,(Db *)last);
    if (paVar2 == paVar4) {
      return (char *)this;
    }
    paVar3 = (anon_unknown_0 *)
             parse_template_args<__cxxabiv1::(anonymous_namespace)::Db>
                       ((char *)paVar2,first,(Db *)last);
    if (paVar3 == paVar2) {
      return (char *)paVar3;
    }
    if ((ulong)(*(long *)(last + 0x10) - *(long *)(last + 8)) < 0x41) {
      return (char *)paVar3;
    }
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_50,
                (string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
                 *)(*(long *)(last + 0x10) + -0x40));
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::pop_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                *)last);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
              *)(*(long *)(last + 0x10) + -0x40),&local_50);
  }
  else {
    paVar4 = (anon_unknown_0 *)
             parse_simple_id<__cxxabiv1::(anonymous_namespace)::Db>((char *)this,first,(Db *)last);
    if (paVar4 != this) {
      return (char *)paVar4;
    }
    paVar4 = (anon_unknown_0 *)
             parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                       ((char *)this,first,(Db *)last);
    if (paVar4 == this) {
      return (char *)this;
    }
    paVar3 = (anon_unknown_0 *)
             parse_template_args<__cxxabiv1::(anonymous_namespace)::Db>
                       ((char *)paVar4,first,(Db *)last);
    if (paVar3 == paVar4) {
      return (char *)paVar3;
    }
    if ((ulong)(*(long *)(last + 0x10) - *(long *)(last + 8)) < 0x41) {
      return (char *)paVar3;
    }
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_50,
                (string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
                 *)(*(long *)(last + 0x10) + -0x40));
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::pop_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                *)last);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::append((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
              *)(*(long *)(last + 0x10) + -0x40),&local_50);
  }
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  ::_M_dispose(&local_50);
  return (char *)paVar3;
}

Assistant:

const char*
parse_base_unresolved_name(const char* first, const char* last, C& db)
{
    if (last - first >= 2)
    {
        if ((first[0] == 'o' || first[0] == 'd') && first[1] == 'n')
        {
            if (first[0] == 'o')
            {
                const char* t = parse_operator_name(first+2, last, db);
                if (t != first+2)
                {
                    first = parse_template_args(t, last, db);
                    if (first != t)
                    {
                        if (db.names.size() < 2)
                            return first;
                        auto args = db.names.back().move_full();
                        db.names.pop_back();
                        db.names.back().first += std::move(args);
                    }
                }
            }
            else
            {
                const char* t = parse_destructor_name(first+2, last, db);
                if (t != first+2)
                    first = t;
            }
        }
        else
        {
            const char* t = parse_simple_id(first, last, db);
            if (t == first)
            {
                t = parse_operator_name(first, last, db);
                if (t != first)
                {
                    first = parse_template_args(t, last, db);
                    if (first != t)
                    {
                        if (db.names.size() < 2)
                            return first;
                        auto args = db.names.back().move_full();
                        db.names.pop_back();
                        db.names.back().first += std::move(args);
                    }
                }
            }
            else
                first = t;
        }
    }
    return first;
}